

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O0

optional<bidfx_public_api::price::pixie::FieldDef> * __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid
          (optional<bidfx_public_api::price::pixie::FieldDef> *__return_storage_ptr__,
          ExtendableDataDictionary *this,int fid)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator it;
  int fid_local;
  ExtendableDataDictionary *this_local;
  
  it._M_node._4_4_ = fid;
  if (fid < 0) {
    std::optional<bidfx_public_api::price::pixie::FieldDef>::optional(__return_storage_ptr__);
  }
  else {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_bidfx_public_api::price::pixie::FieldDef,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
         ::find(&this->field_defs_by_fid_,(key_type *)((long)&it._M_node + 4));
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_bidfx_public_api::price::pixie::FieldDef,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
         ::end(&this->field_defs_by_fid_);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      std::optional<bidfx_public_api::price::pixie::FieldDef>::optional(__return_storage_ptr__);
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>::
               operator->(&local_28);
      std::optional<bidfx_public_api::price::pixie::FieldDef>::
      optional<bidfx_public_api::price::pixie::FieldDef_&,_true>
                (__return_storage_ptr__,&ppVar2->second);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<FieldDef> ExtendableDataDictionary::FieldDefByFid(int fid)
{
    if (fid < 0)
    {
        return {};
    }
    else
    {
        auto it = field_defs_by_fid_.find(fid);
        if (it == field_defs_by_fid_.end())
        {
            return {};
        }
        return it->second;
    }
}